

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts5SegIterSeekInit(Fts5Index *p,u8 *pTerm,int nTerm,int flags,Fts5StructureSegment *pSeg,
                        Fts5SegIter *pIter)

{
  int *pRc;
  Fts5StructureSegment *pFVar1;
  bool bVar2;
  Fts5Data *p_00;
  byte bVar3;
  ushort uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  char *zSql;
  Fts5Data *pFVar8;
  Fts5Data *pFVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  u8 *puVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  u32 uVar17;
  sqlite3_stmt *p_01;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  uint nData;
  long in_FS_OFFSET;
  bool bVar21;
  uint local_84;
  u32 local_4c;
  u32 local_48;
  uint local_44;
  u32 nKeep;
  uint local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pIter->pSeg = (Fts5StructureSegment *)0x0;
  pIter->flags = 0;
  pIter->iLeafPgno = 0;
  pIter->iRowid = 0;
  pIter->nPos = 0;
  pIter->bDel = '\0';
  *(undefined3 *)&pIter->field_0x7d = 0;
  (pIter->term).p = (u8 *)0x0;
  (pIter->term).n = 0;
  (pIter->term).nSpace = 0;
  pIter->aRowidOffset = (int *)0x0;
  pIter->pDlidx = (Fts5DlidxIter *)0x0;
  pIter->iPgidxOff = 0;
  pIter->iEndofDoclist = 0;
  pIter->iRowidOffset = 0;
  pIter->nRowidOffset = 0;
  pIter->xNext = (_func_void_Fts5Index_ptr_Fts5SegIter_ptr_int_ptr *)0x0;
  pIter->iTermLeafPgno = 0;
  pIter->iTermLeafOffset = 0;
  pIter->iLeafOffset = 0;
  pIter->pTombArray = (Fts5TombstoneArray *)0x0;
  pIter->pLeaf = (Fts5Data *)0x0;
  pIter->pNextLeaf = (Fts5Data *)0x0;
  pIter->pSeg = pSeg;
  p_01 = p->pIdxSelect;
  if (p_01 == (sqlite3_stmt *)0x0) {
    zSql = sqlite3_mprintf("SELECT pgno FROM \'%q\'.\'%q_idx\' WHERE segid=? AND term<=? ORDER BY term DESC LIMIT 1"
                           ,p->pConfig->zDb,p->pConfig->zName);
    fts5IndexPrepareStmt(p,&p->pIdxSelect,zSql);
    p_01 = p->pIdxSelect;
  }
  if (p->rc == 0) {
    iVar11 = 1;
    sqlite3_bind_int(p_01,1,pSeg->iSegid);
    sqlite3_bind_blob(p_01,2,pTerm,nTerm,(_func_void_void_ptr *)0x0);
    iVar5 = sqlite3_step(p_01);
    bVar21 = true;
    if (iVar5 == 100) {
      uVar6 = sqlite3_column_int(p_01,0);
      iVar11 = (int)uVar6 >> 1;
      bVar21 = (uVar6 & 1) == 0;
    }
    pRc = &p->rc;
    iVar5 = sqlite3_reset(p_01);
    p->rc = iVar5;
    sqlite3_bind_null(p_01,2);
    iVar5 = pSeg->pgnoFirst;
    iVar7 = iVar5;
    if (iVar5 < iVar11) {
      iVar7 = iVar11;
    }
    pIter->iLeafPgno = iVar7 + -1;
    fts5SegIterNextPage(p,pIter);
    pFVar8 = pIter->pLeaf;
    if (pFVar8 != (Fts5Data *)0x0) {
      puVar13 = pFVar8->p;
      uVar6 = pFVar8->nn;
      nKeep = 0;
      local_48 = 0xaaaaaaaa;
      local_84 = pFVar8->szLeaf;
      iVar7 = sqlite3Fts5GetVarint32(puVar13 + local_84,&local_48);
      if (uVar6 < local_48) goto LAB_001c94a0;
      local_84 = iVar7 + local_84;
      uVar17 = local_48;
      nData = 0;
      uVar19 = local_48;
LAB_001c94d0:
      local_44 = (uint)puVar13[uVar17];
      if ((char)puVar13[uVar17] < '\0') {
        iVar7 = sqlite3Fts5GetVarint32(puVar13 + uVar17,&local_44);
        uVar16 = uVar17 + iVar7;
      }
      else {
        uVar16 = uVar17 + 1;
      }
      uVar17 = nKeep;
      if (nKeep < nData) {
LAB_001c96b3:
        nData = uVar17;
        local_48 = uVar19;
        if ((flags & 8U) != 0) goto LAB_001c97ea;
LAB_001c96c8:
        local_3c = uVar16;
        sqlite3_free(pFVar8);
        pIter->pLeaf = (Fts5Data *)0x0;
        goto LAB_001c96ef;
      }
      uVar12 = nData;
      if (nKeep == nData) {
        uVar15 = nTerm - nData;
        if (local_44 < nTerm - nData) {
          uVar15 = local_44;
        }
        uVar20 = 0;
        do {
          if (uVar15 == uVar20) goto LAB_001c9541;
          iVar7 = (int)uVar20;
          uVar20 = uVar20 + 1;
        } while (puVar13[uVar16 + iVar7] == pTerm[nData + iVar7]);
        uVar15 = (int)uVar20 - 1;
LAB_001c9541:
        uVar12 = uVar15 + nData;
        uVar17 = nData;
        if (uVar12 != nTerm) {
          if ((local_44 <= uVar15) || (puVar13[uVar15 + uVar16] <= pTerm[uVar12]))
          goto LAB_001c956e;
          goto LAB_001c96b3;
        }
        local_48 = uVar19;
        if (uVar15 == local_44) goto LAB_001c97ea;
        goto LAB_001c96b3;
      }
LAB_001c956e:
      if (uVar6 <= local_84) {
        local_3c = uVar16;
        if ((flags & 8U) == 0) goto LAB_001c96c8;
        goto LAB_001c9602;
      }
      iVar7 = sqlite3Fts5GetVarint32(puVar13 + local_84,&nKeep);
      uVar19 = uVar19 + nKeep;
      if (uVar19 < uVar6) {
        local_84 = local_84 + iVar7;
        uVar17 = uVar19 + 1;
        nKeep = (u32)puVar13[uVar19];
        nData = uVar12;
        if ((char)puVar13[uVar19] < '\0') {
          iVar7 = sqlite3Fts5GetVarint32(puVar13 + uVar19,&nKeep);
          uVar17 = iVar7 + uVar19;
        }
        goto LAB_001c94d0;
      }
      *pRc = 0x10b;
    }
    goto LAB_001c96ef;
  }
  goto LAB_001c9a11;
  while( true ) {
    local_84 = pFVar8->szLeaf;
    uVar6 = pFVar8->nn;
    if ((int)local_84 < (int)uVar6) break;
LAB_001c9602:
    fts5SegIterNextPage(p,pIter);
    pFVar8 = pIter->pLeaf;
    if (pFVar8 == (Fts5Data *)0x0) goto LAB_001c96ef;
  }
  puVar13 = pFVar8->p;
  iVar7 = sqlite3Fts5GetVarint32(puVar13 + local_84,&local_3c);
  uVar19 = local_3c;
  uVar20 = (ulong)local_3c;
  if ((3 < uVar20) && ((long)uVar20 < (long)(int)local_84)) {
    nKeep = 0;
    local_84 = iVar7 + local_84;
    local_48 = local_3c;
    iVar7 = sqlite3Fts5GetVarint32(puVar13 + uVar20,&local_44);
    uVar16 = iVar7 + uVar19;
    nData = 0;
LAB_001c97ea:
    uVar12 = local_44;
    local_3c = uVar16;
    if (((ulong)local_44 != 0) && ((ulong)local_44 + (ulong)uVar16 <= (ulong)uVar6)) {
      pIter->iLeafOffset = (ulong)(uVar16 + local_44);
      pIter->iTermLeafOffset = uVar16 + local_44;
      pIter->iTermLeafPgno = pIter->iLeafPgno;
      sqlite3Fts5BufferSet(pRc,&pIter->term,nData,pTerm);
      sqlite3Fts5BufferAppendBlob(pRc,&pIter->term,uVar12,puVar13 + uVar16);
      if (local_84 < uVar6) {
        local_4c = 0xaaaaaaaa;
        iVar7 = sqlite3Fts5GetVarint32(puVar13 + local_84,&local_4c);
        local_84 = local_84 + iVar7;
        iVar7 = uVar19 + local_4c;
      }
      else {
        iVar7 = pIter->pLeaf->nn + 1;
      }
      pIter->iEndofDoclist = iVar7;
      pIter->iPgidxOff = local_84;
      fts5SegIterLoadRowid(p,pIter);
      fts5SegIterLoadNPos(p,pIter);
      goto LAB_001c96ef;
    }
  }
LAB_001c94a0:
  *pRc = 0x10b;
LAB_001c96ef:
  if (((flags & 0x108U) != 8) && (*pRc == 0)) {
    uVar6 = pIter->flags;
    pIter->flags = uVar6 | 1;
    if (pIter->pLeaf != (Fts5Data *)0x0) {
      if ((flags & 2U) != 0) {
        pIter->flags = uVar6 | 3;
      }
      if (iVar5 <= iVar11 && !bVar21) {
        fts5SegIterLoadDlidx(p,pIter);
      }
      if ((flags & 2U) != 0) {
        if ((pIter->pDlidx == (Fts5DlidxIter *)0x0) || (p->pConfig->iVersion != 4)) {
          uVar20 = (ulong)pIter->iLeafPgno;
          if (pIter->iTermLeafPgno == pIter->iLeafPgno) {
            iVar5 = pIter->iTermLeafOffset;
          }
          else {
            iVar5 = 4;
          }
          lVar10 = (long)iVar5 << 0x20;
          lVar14 = (long)iVar5;
          do {
            lVar10 = lVar10 + 0x100000000;
            if (-1 < (char)pIter->pLeaf->p[lVar14]) break;
            bVar21 = lVar14 < iVar5 + 8;
            lVar14 = lVar14 + 1;
          } while (bVar21);
          pIter->iLeafOffset = lVar10 >> 0x20;
          if (pIter->pLeaf->szLeaf <= pIter->iEndofDoclist) {
            pFVar1 = pIter->pSeg;
            uVar18 = 0;
            pFVar8 = (Fts5Data *)0x0;
            do {
              do {
                iVar5 = (int)uVar18;
                if ((*pRc != 0) || ((long)pFVar1->pgnoLast <= (long)uVar20)) goto LAB_001c9784;
                pFVar9 = fts5LeafRead(p,uVar20 + ((ulong)(uint)pFVar1->iSegid << 0x25) + 1);
                uVar20 = uVar20 + 1;
              } while (pFVar9 == (Fts5Data *)0x0);
              iVar11 = pFVar9->szLeaf;
              bVar21 = pFVar9->p[1] != '\0';
              bVar2 = *pFVar9->p != '\0';
              iVar7 = pFVar9->nn;
              p_00 = pFVar9;
              if (bVar21 || bVar2) {
                uVar18 = uVar20 & 0xffffffff;
                p_00 = pFVar8;
              }
              iVar5 = (int)uVar18;
              if (bVar21 || bVar2) {
                pFVar8 = pFVar9;
              }
              sqlite3_free(p_00);
            } while (iVar7 <= iVar11);
            goto LAB_001c9784;
          }
        }
        else {
          iVar5 = pIter->pDlidx->aLvl[0].iLeafPgno;
          pFVar8 = fts5LeafRead(p,((ulong)(uint)pIter->pSeg->iSegid << 0x25) + (long)iVar5);
LAB_001c9784:
          if (pFVar8 != (Fts5Data *)0x0) {
            sqlite3_free(pIter->pLeaf);
            pIter->pLeaf = pFVar8;
            pIter->iLeafPgno = iVar5;
            uVar4 = *(ushort *)pFVar8->p;
            uVar4 = uVar4 << 8 | uVar4 >> 8;
            if (pFVar8->szLeaf < (int)(uint)uVar4) {
              *pRc = 0x10b;
              goto LAB_001c99da;
            }
            bVar3 = sqlite3Fts5GetVarint
                              ((uchar *)((long)pFVar8->p + (ulong)uVar4),(u64 *)&pIter->iRowid);
            pIter->iLeafOffset = (ulong)((uint)bVar3 + (uint)uVar4);
            if (pFVar8->szLeaf < pFVar8->nn) {
              iVar5 = fts5LeafFirstTermOff(pFVar8);
            }
            else {
              iVar5 = pFVar8->nn + 1;
            }
            pIter->iEndofDoclist = iVar5;
          }
        }
        fts5SegIterReverseInitPage(p,pIter);
      }
    }
  }
LAB_001c99da:
  fts5SegIterSetNext(p,pIter);
  if (((uint)flags >> 8 & 1) == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      fts5SegIterAllocTombstone(p,pIter);
      return;
    }
    goto LAB_001c9a30;
  }
LAB_001c9a11:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_001c9a30:
  __stack_chk_fail();
}

Assistant:

static void fts5SegIterSeekInit(
  Fts5Index *p,                   /* FTS5 backend */
  const u8 *pTerm, int nTerm,     /* Term to seek to */
  int flags,                      /* Mask of FTS5INDEX_XXX flags */
  Fts5StructureSegment *pSeg,     /* Description of segment */
  Fts5SegIter *pIter              /* Object to populate */
){
  int iPg = 1;
  int bGe = (flags & FTS5INDEX_QUERY_SCAN);
  int bDlidx = 0;                 /* True if there is a doclist-index */
  sqlite3_stmt *pIdxSelect = 0;

  assert( bGe==0 || (flags & FTS5INDEX_QUERY_DESC)==0 );
  assert( pTerm && nTerm );
  memset(pIter, 0, sizeof(*pIter));
  pIter->pSeg = pSeg;

  /* This block sets stack variable iPg to the leaf page number that may
  ** contain term (pTerm/nTerm), if it is present in the segment. */
  pIdxSelect = fts5IdxSelectStmt(p);
  if( p->rc ) return;
  sqlite3_bind_int(pIdxSelect, 1, pSeg->iSegid);
  sqlite3_bind_blob(pIdxSelect, 2, pTerm, nTerm, SQLITE_STATIC);
  if( SQLITE_ROW==sqlite3_step(pIdxSelect) ){
    i64 val = sqlite3_column_int(pIdxSelect, 0);
    iPg = (int)(val>>1);
    bDlidx = (val & 0x0001);
  }
  p->rc = sqlite3_reset(pIdxSelect);
  sqlite3_bind_null(pIdxSelect, 2);

  if( iPg<pSeg->pgnoFirst ){
    iPg = pSeg->pgnoFirst;
    bDlidx = 0;
  }

  pIter->iLeafPgno = iPg - 1;
  fts5SegIterNextPage(p, pIter);

  if( pIter->pLeaf ){
    fts5LeafSeek(p, bGe, pIter, pTerm, nTerm);
  }

  if( p->rc==SQLITE_OK && (bGe==0 || (flags & FTS5INDEX_QUERY_SCANONETERM)) ){
    pIter->flags |= FTS5_SEGITER_ONETERM;
    if( pIter->pLeaf ){
      if( flags & FTS5INDEX_QUERY_DESC ){
        pIter->flags |= FTS5_SEGITER_REVERSE;
      }
      if( bDlidx ){
        fts5SegIterLoadDlidx(p, pIter);
      }
      if( flags & FTS5INDEX_QUERY_DESC ){
        fts5SegIterReverse(p, pIter);
      }
    }
  }

  fts5SegIterSetNext(p, pIter);
  if( 0==(flags & FTS5INDEX_QUERY_SCANONETERM) ){
    fts5SegIterAllocTombstone(p, pIter);
  }

  /* Either:
  **
  **   1) an error has occurred, or
  **   2) the iterator points to EOF, or
  **   3) the iterator points to an entry with term (pTerm/nTerm), or
  **   4) the FTS5INDEX_QUERY_SCAN flag was set and the iterator points
  **      to an entry with a term greater than or equal to (pTerm/nTerm).
  */
  assert_nc( p->rc!=SQLITE_OK                                       /* 1 */
   || pIter->pLeaf==0                                               /* 2 */
   || fts5BufferCompareBlob(&pIter->term, pTerm, nTerm)==0          /* 3 */
   || (bGe && fts5BufferCompareBlob(&pIter->term, pTerm, nTerm)>0)  /* 4 */
  );
}